

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_trace_diag_avx2_256_64.c
# Opt level: O3

parasail_result_t *
parasail_sw_trace_diag_avx2_256_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int64_t iVar1;
  int *piVar2;
  int *piVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  int iVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  uint uVar17;
  int iVar18;
  parasail_result_t *ppVar19;
  undefined1 (*ptr) [16];
  int64_t *ptr_00;
  int64_t *ptr_01;
  int64_t *ptr_02;
  long lVar20;
  ulong uVar21;
  int64_t iVar22;
  uint uVar23;
  int iVar24;
  ulong uVar25;
  int64_t iVar26;
  long lVar27;
  ulong uVar28;
  int64_t iVar29;
  uint uVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  long lVar35;
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 in_ZMM15 [64];
  undefined1 auVar58 [64];
  long local_328;
  long local_320;
  long local_318;
  long local_310;
  undefined1 local_300 [32];
  undefined1 local_2c0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  long local_240;
  long lStack_238;
  long lStack_230;
  long lStack_228;
  long local_220;
  long lStack_218;
  long lStack_210;
  long lStack_208;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  long local_1a0;
  long lStack_198;
  long lStack_190;
  long lStack_188;
  undefined1 local_180 [32];
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  ulong local_c0;
  ulong uStack_b8;
  ulong uStack_b0;
  ulong uStack_a8;
  undefined1 local_a0 [32];
  ulong local_80;
  ulong uStack_78;
  ulong uStack_70;
  ulong uStack_68;
  
  if (_s2 == (char *)0x0) {
    parasail_sw_trace_diag_avx2_256_64_cold_7();
  }
  else {
    uVar33 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      parasail_sw_trace_diag_avx2_256_64_cold_6();
    }
    else if (open < 0) {
      parasail_sw_trace_diag_avx2_256_64_cold_5();
    }
    else if (gap < 0) {
      parasail_sw_trace_diag_avx2_256_64_cold_4();
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      parasail_sw_trace_diag_avx2_256_64_cold_3();
    }
    else {
      if (matrix->type == 0) {
        if (_s1 == (char *)0x0) {
          parasail_sw_trace_diag_avx2_256_64_cold_2();
          return (parasail_result_t *)0x0;
        }
        if (_s1Len < 1) {
          parasail_sw_trace_diag_avx2_256_64_cold_1();
          return (parasail_result_t *)0x0;
        }
      }
      else {
        _s1Len = matrix->length;
      }
      iVar18 = matrix->min;
      uVar21 = (ulong)(uint)open;
      uVar25 = 0x8000000000000000 - (long)iVar18;
      if (iVar18 != -open && SBORROW4(iVar18,-open) == iVar18 + open < 0) {
        uVar25 = uVar21 | 0x8000000000000000;
      }
      lVar27 = uVar25 + 1;
      iVar18 = matrix->max;
      local_1c0._8_8_ = lVar27;
      local_1c0._0_8_ = lVar27;
      local_1c0._16_8_ = lVar27;
      local_1c0._24_8_ = lVar27;
      local_260._8_8_ = lVar27;
      local_260._0_8_ = lVar27;
      local_260._16_8_ = lVar27;
      local_260._24_8_ = lVar27;
      local_1e0._8_8_ = lVar27;
      local_1e0._0_8_ = lVar27;
      local_1e0._16_8_ = lVar27;
      local_1e0._24_8_ = lVar27;
      auVar50 = in_ZMM15._0_16_;
      local_220 = lVar27;
      lStack_218 = lVar27;
      lStack_210 = lVar27;
      lStack_208 = lVar27;
      ppVar19 = parasail_result_new_trace(_s1Len,s2Len,0x20,1);
      if (ppVar19 != (parasail_result_t *)0x0) {
        local_200._0_4_ = gap;
        ppVar19->flag = ppVar19->flag | 0x4881004;
        uVar25 = (ulong)(s2Len + 6);
        ptr = (undefined1 (*) [16])parasail_memalign_int64_t(0x20,uVar25);
        ptr_00 = parasail_memalign_int64_t(0x20,uVar25);
        ptr_01 = parasail_memalign_int64_t(0x20,uVar25);
        if (ptr_01 != (int64_t *)0x0 &&
            (ptr_00 != (int64_t *)0x0 && ptr != (undefined1 (*) [16])0x0)) {
          lVar35 = (long)_s1Len;
          if (matrix->type == 0) {
            iVar24 = _s1Len + 3;
            ptr_02 = parasail_memalign_int64_t(0x20,(long)iVar24);
            if (ptr_02 == (int64_t *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (0 < _s1Len) {
              piVar2 = matrix->mapper;
              lVar20 = 0;
              do {
                ptr_02[lVar20] = (long)piVar2[(byte)_s1[lVar20]];
                lVar20 = lVar20 + 1;
              } while (lVar35 != lVar20);
            }
            iVar9 = _s1Len + 1U;
            if ((int)(_s1Len + 1U) < iVar24) {
              iVar9 = iVar24;
            }
            memset(ptr_02 + lVar35,0,(ulong)(uint)(~_s1Len + iVar9) * 8 + 8);
          }
          else {
            ptr_02 = (int64_t *)0x0;
          }
          uVar30 = s2Len + 3;
          local_240 = 0x7ffffffffffffffe - (long)iVar18;
          auVar45._8_8_ = lStack_218;
          auVar45._0_8_ = local_220;
          auVar45._16_8_ = lStack_210;
          auVar45._24_8_ = lStack_208;
          local_180 = vpblendd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar45,0x3f);
          local_a0._4_4_ = 0;
          local_a0._0_4_ = local_200._0_4_;
          local_a0._8_4_ = local_200._0_4_;
          local_a0._12_4_ = 0;
          local_a0._16_4_ = local_200._0_4_;
          local_a0._20_4_ = 0;
          local_a0._24_4_ = local_200._0_4_;
          local_a0._28_4_ = 0;
          piVar2 = matrix->mapper;
          uVar25 = 0;
          do {
            *(long *)(ptr[1] + uVar25 * 8 + 8) = (long)piVar2[(byte)_s2[uVar25]];
            uVar25 = uVar25 + 1;
          } while (uVar33 != uVar25);
          *ptr = (undefined1  [16])0x0;
          *(undefined8 *)ptr[1] = 0;
          uVar23 = s2Len + 1U;
          if ((int)(s2Len + 1U) < (int)uVar30) {
            uVar23 = uVar30;
          }
          uVar25 = 0;
          auVar58 = ZEXT1664(auVar50);
          lStack_238 = local_240;
          lStack_230 = local_240;
          lStack_228 = local_240;
          local_1a0 = lVar35;
          lStack_198 = lVar35;
          lStack_190 = lVar35;
          lStack_188 = lVar35;
          local_c0 = uVar33;
          uStack_b8 = uVar33;
          uStack_b0 = uVar33;
          uStack_a8 = uVar33;
          local_80 = uVar21;
          uStack_78 = uVar21;
          uStack_70 = uVar21;
          uStack_68 = uVar21;
          memset(ptr[1] + uVar33 * 8 + 8,0,(ulong)(~s2Len + uVar23) * 8 + 8);
          do {
            ptr_00[uVar25 + 3] = 0;
            ptr_01[uVar25 + 3] = lVar27;
            uVar25 = uVar25 + 1;
          } while (uVar33 != uVar25);
          lVar20 = 0;
          do {
            ptr_00[lVar20] = lVar27;
            ptr_01[lVar20] = lVar27;
            lVar20 = lVar20 + 1;
          } while (lVar20 != 3);
          lVar20 = uVar33 + 3;
          local_1c0._8_8_ = lStack_218;
          local_1c0._0_8_ = local_220;
          local_1c0._16_8_ = lStack_210;
          local_1c0._24_8_ = lStack_208;
          auVar48 = ZEXT3264(local_1c0);
          uVar21 = uVar33;
          do {
            ptr_00[lVar20] = lVar27;
            ptr_01[lVar20] = lVar27;
            lVar20 = lVar20 + 1;
            uVar23 = (int)uVar21 + 1;
            uVar21 = (ulong)uVar23;
          } while ((int)uVar23 < (int)uVar30);
          local_280._8_8_ = lStack_238;
          local_280._0_8_ = local_240;
          local_280._16_8_ = lStack_230;
          local_280._24_8_ = lStack_228;
          local_1e0 = local_1c0;
          local_260 = local_1c0;
          auVar47 = local_1c0;
          local_2c0 = local_1c0;
          if (0 < _s1Len) {
            uVar23 = _s1Len - 1;
            uVar21 = 1;
            if (1 < (int)uVar30) {
              uVar21 = (ulong)uVar30;
            }
            local_310 = uVar33 * 3 + -3;
            lVar20 = uVar33 * 4;
            local_328 = uVar33 * 2 + -2;
            local_318 = uVar33 - 1;
            local_300._8_8_ = 2;
            local_300._0_8_ = 3;
            local_300._16_8_ = 1;
            local_300._24_8_ = 0;
            local_320 = 0;
            local_e0 = 1;
            uStack_d8 = 1;
            uStack_d0 = 1;
            uStack_c8 = 1;
            local_100 = 8;
            uStack_f8 = 8;
            uStack_f0 = 8;
            uStack_e8 = 8;
            local_120 = 0x10;
            uStack_118 = 0x10;
            uStack_110 = 0x10;
            uStack_108 = 0x10;
            local_140 = 0x20;
            uStack_138 = 0x20;
            uStack_130 = 0x20;
            uStack_128 = 0x20;
            local_160 = 0x40;
            uStack_158 = 0x40;
            uStack_150 = 0x40;
            uStack_148 = 0x40;
            uVar25 = 0;
            auVar53 = ZEXT3264(local_1c0);
            auVar52 = ZEXT3264(local_1c0);
            auVar49 = ZEXT3264(local_1c0);
            do {
              uVar34 = uVar25 | 2;
              if (matrix->type == 0) {
                uVar28 = ptr_02[uVar25];
                iVar26 = ptr_02[uVar25 + 1];
                iVar22 = ptr_02[uVar34];
                iVar29 = ptr_02[uVar25 + 3];
              }
              else {
                uVar30 = (uint)uVar25;
                uVar17 = uVar30 | 1;
                if (lVar35 <= (long)(uVar25 | 1)) {
                  uVar17 = uVar23;
                }
                iVar26 = (int64_t)(int)uVar17;
                uVar17 = uVar30 | 2;
                if (lVar35 <= (long)uVar34) {
                  uVar17 = uVar23;
                }
                iVar22 = (int64_t)(int)uVar17;
                uVar30 = uVar30 | 3;
                if (lVar35 <= (long)(uVar25 | 3)) {
                  uVar30 = uVar23;
                }
                iVar29 = (int64_t)(int)uVar30;
                uVar28 = uVar25;
              }
              piVar2 = matrix->matrix;
              lVar31 = (long)matrix->size;
              auVar7._8_8_ = lStack_198;
              auVar7._0_8_ = local_1a0;
              auVar7._16_8_ = lStack_190;
              auVar7._24_8_ = lStack_188;
              local_200 = vpcmpgtq_avx2(auVar7,local_300);
              uVar32 = 0;
              auVar5 = vpmovsxbq_avx2(ZEXT416(0xfffefd));
              auVar45 = auVar48._0_32_;
              auVar47 = vpcmpeqd_avx2(auVar58._0_32_,auVar58._0_32_);
              auVar58 = ZEXT3264(auVar47);
              auVar6 = local_180;
              auVar8 = local_180;
              auVar7 = auVar45;
              do {
                auVar39 = vpermq_avx2(auVar6,0xf9);
                iVar1 = ptr_00[uVar32 + 3];
                auVar38._8_8_ = iVar1;
                auVar38._0_8_ = iVar1;
                auVar38._16_8_ = iVar1;
                auVar38._24_8_ = iVar1;
                auVar50._8_8_ = 0;
                auVar50._0_8_ = (long)piVar2[uVar28 * lVar31 + *(long *)(ptr[1] + uVar32 * 8 + 8)];
                auVar54._8_8_ = 0;
                auVar54._0_8_ = (long)piVar2[iVar26 * lVar31 + *(long *)(ptr[1] + uVar32 * 8)];
                auVar50 = vpunpcklqdq_avx(auVar54,auVar50);
                auVar55._8_8_ = 0;
                auVar55._0_8_ = (long)piVar2[iVar22 * lVar31 + *(long *)(*ptr + uVar32 * 8 + 8)];
                auVar57._8_8_ = 0;
                auVar57._0_8_ = (long)piVar2[iVar29 * lVar31 + *(long *)(*ptr + uVar32 * 8)];
                auVar54 = vpunpcklqdq_avx(auVar57,auVar55);
                auVar51._0_16_ = ZEXT116(0) * auVar50 + ZEXT116(1) * auVar54;
                auVar51._16_16_ = ZEXT116(1) * auVar50;
                auVar47 = vpaddq_avx2(auVar51,auVar8);
                auVar8 = vpblendd_avx2(auVar39,auVar38,0xc0);
                auVar45 = vpermq_avx2(auVar45,0xf9);
                iVar1 = ptr_01[uVar32 + 3];
                auVar39._8_8_ = iVar1;
                auVar39._0_8_ = iVar1;
                auVar39._16_8_ = iVar1;
                auVar39._24_8_ = iVar1;
                auVar39 = vpblendd_avx2(auVar45,auVar39,0xc0);
                auVar4._8_8_ = uStack_78;
                auVar4._0_8_ = local_80;
                auVar4._16_8_ = uStack_70;
                auVar4._24_8_ = uStack_68;
                auVar45 = vpsubq_avx2(auVar8,auVar4);
                auVar39 = vpsubq_avx2(auVar39,local_a0);
                auVar6 = vpsubq_avx2(auVar6,auVar4);
                auVar7 = vpsubq_avx2(auVar7,local_a0);
                auVar4 = vpcmpgtq_avx2(auVar45,auVar39);
                auVar45 = vblendvpd_avx(auVar39,auVar45,auVar4);
                auVar38 = vpcmpgtq_avx2(auVar6,auVar7);
                auVar7 = vblendvpd_avx(auVar7,auVar6,auVar38);
                auVar6 = vpcmpgtq_avx2(auVar47,_DAT_00908c40);
                auVar39 = vpand_avx2(auVar47,auVar6);
                auVar47 = vpcmpgtq_avx2(auVar39,auVar7);
                auVar47 = vblendvpd_avx(auVar7,auVar39,auVar47);
                auVar6 = vpcmpgtq_avx2(auVar47,auVar45);
                auVar47 = vblendvpd_avx(auVar45,auVar47,auVar6);
                auVar56._0_8_ = -(ulong)(auVar5._0_8_ == auVar58._0_8_);
                auVar56._8_8_ = -(ulong)(auVar5._8_8_ == auVar58._8_8_);
                auVar56._16_8_ = -(ulong)(auVar5._16_8_ == auVar58._16_8_);
                auVar56._24_8_ = -(ulong)(auVar5._24_8_ == auVar58._24_8_);
                auVar6 = vpandn_avx2(auVar56,auVar47);
                auVar45 = vblendvpd_avx(auVar45,auVar48._0_32_,auVar56);
                if (3 < uVar32) {
                  auVar51 = vpcmpgtq_avx2(auVar6,local_280);
                  local_280 = vblendvpd_avx(auVar6,local_280,auVar51);
                  auVar51 = vpcmpgtq_avx2(local_2c0,auVar6);
                  local_2c0 = vblendvpd_avx(auVar6,local_2c0,auVar51);
                }
                lVar41 = auVar6._0_8_;
                auVar36._0_8_ = -(ulong)(lVar41 == auVar39._0_8_);
                lVar42 = auVar6._8_8_;
                auVar36._8_8_ = -(ulong)(lVar42 == auVar39._8_8_);
                lVar43 = auVar6._16_8_;
                auVar36._16_8_ = -(ulong)(lVar43 == auVar39._16_8_);
                lVar44 = auVar6._24_8_;
                auVar36._24_8_ = -(ulong)(lVar44 == auVar39._24_8_);
                auVar37._0_8_ = -(ulong)(lVar41 == auVar45._0_8_);
                auVar37._8_8_ = -(ulong)(lVar42 == auVar45._8_8_);
                auVar37._16_8_ = -(ulong)(lVar43 == auVar45._16_8_);
                auVar37._24_8_ = -(ulong)(lVar44 == auVar45._24_8_);
                auVar15._8_8_ = 1;
                auVar15._0_8_ = 1;
                auVar15._16_8_ = 1;
                auVar15._24_8_ = 1;
                auVar51 = vpsubq_avx2(auVar15,auVar37);
                auVar46._0_8_ = -(ulong)(lVar41 == 0);
                auVar46._8_8_ = -(ulong)(lVar42 == 0);
                auVar46._16_8_ = -(ulong)(lVar43 == 0);
                auVar46._24_8_ = -(ulong)(lVar44 == 0);
                auVar10._8_8_ = 4;
                auVar10._0_8_ = 4;
                auVar10._16_8_ = 4;
                auVar10._24_8_ = 4;
                auVar39 = vpandn_avx2(auVar46,auVar10);
                auVar39 = vblendvpd_avx(auVar51,auVar39,auVar36);
                auVar13._8_8_ = 0x10;
                auVar13._0_8_ = 0x10;
                auVar13._16_8_ = 0x10;
                auVar13._24_8_ = 0x10;
                auVar14._8_8_ = 8;
                auVar14._0_8_ = 8;
                auVar14._16_8_ = 8;
                auVar14._24_8_ = 8;
                auVar38 = vblendvpd_avx(auVar13,auVar14,auVar38);
                auVar11._8_8_ = 0x40;
                auVar11._0_8_ = 0x40;
                auVar11._16_8_ = 0x40;
                auVar11._24_8_ = 0x40;
                auVar12._8_8_ = 0x20;
                auVar12._0_8_ = 0x20;
                auVar12._16_8_ = 0x20;
                auVar12._24_8_ = 0x20;
                auVar4 = vblendvpd_avx(auVar11,auVar12,auVar4);
                auVar4 = vorpd_avx(auVar4,auVar38);
                auVar39 = vorpd_avx(auVar4,auVar39);
                piVar3 = ((ppVar19->field_4).rowcols)->score_row;
                if (uVar32 < uVar33) {
                  *(char *)((long)piVar3 + uVar32 + local_320) = auVar39[0x10];
                }
                if (uVar32 - 1 < uVar33 && (long)(uVar25 | 1) < lVar35) {
                  *(char *)((long)piVar3 + uVar32 + local_318) = auVar39[0x10];
                }
                if (((long)uVar34 < lVar35) && ((long)(uVar32 - 2) < (long)uVar33 && 1 < uVar32)) {
                  *(char *)((long)piVar3 + uVar32 + local_328) = auVar39[0];
                }
                if (2 < uVar32 && (long)(uVar25 | 3) < lVar35) {
                  *(char *)((long)piVar3 + uVar32 + local_310) = auVar39[0];
                }
                auVar38 = vpcmpeqd_avx2(auVar58._0_32_,auVar58._0_32_);
                auVar58 = ZEXT3264(auVar38);
                auVar4 = vpcmpgtq_avx2(auVar5,auVar38);
                auVar16._8_8_ = uStack_b8;
                auVar16._0_8_ = local_c0;
                auVar16._16_8_ = uStack_b0;
                auVar16._24_8_ = uStack_a8;
                auVar39 = vpcmpgtq_avx2(auVar16,auVar5);
                auVar39 = vpand_avx2(auVar39,local_200);
                auVar39 = vpand_avx2(auVar39,auVar4);
                auVar50 = vpackssdw_avx(auVar39._0_16_,auVar39._16_16_);
                auVar40._0_8_ = -(ulong)(lVar41 == auVar53._0_8_);
                auVar40._8_8_ = -(ulong)(lVar42 == auVar53._8_8_);
                auVar40._16_8_ = -(ulong)(lVar43 == auVar53._16_8_);
                auVar40._24_8_ = -(ulong)(lVar44 == auVar53._24_8_);
                auVar51 = vpcmpgtq_avx2(auVar6,auVar53._0_32_);
                auVar4 = vpand_avx2(auVar51,auVar39);
                local_1c0 = vblendvpd_avx(auVar53._0_32_,auVar47,auVar4);
                auVar53 = ZEXT3264(local_1c0);
                auVar54 = vpackssdw_avx(auVar4._0_16_,auVar4._16_16_);
                auVar47 = vpcmpgtq_avx2(auVar52._0_32_,auVar5);
                auVar4 = vpand_avx2(auVar47,auVar40);
                auVar55 = vpackssdw_avx(auVar4._0_16_,auVar4._16_16_);
                auVar50 = vblendvps_avx(auVar54,auVar50,auVar55);
                auVar47._8_8_ = lStack_218;
                auVar47._0_8_ = local_220;
                auVar47._16_8_ = lStack_210;
                auVar47._24_8_ = lStack_208;
                auVar7 = vblendvpd_avx(auVar7,auVar47,auVar56);
                auVar56 = vpmovsxdq_avx2(auVar50);
                local_260 = vblendvpd_avx(auVar49._0_32_,local_300,auVar56);
                auVar49 = ZEXT3264(local_260);
                auVar4 = vpor_avx2(auVar4,auVar51);
                auVar48 = ZEXT3264(auVar47);
                auVar39 = vpand_avx2(auVar39,auVar4);
                local_1e0 = vblendvpd_avx(auVar52._0_32_,auVar5,auVar39);
                auVar52 = ZEXT3264(local_1e0);
                ptr_00[uVar32] = lVar41;
                ptr_01[uVar32] = auVar45._0_8_;
                auVar5 = vpsubq_avx2(auVar5,auVar38);
                uVar32 = uVar32 + 1;
              } while (uVar21 != uVar32);
              auVar6._8_8_ = 4;
              auVar6._0_8_ = 4;
              auVar6._16_8_ = 4;
              auVar6._24_8_ = 4;
              local_300 = vpaddq_avx2(local_300,auVar6);
              uVar25 = uVar25 + 4;
              local_310 = local_310 + lVar20;
              local_320 = local_320 + lVar20;
              local_318 = local_318 + lVar20;
              local_328 = local_328 + lVar20;
            } while ((long)uVar25 < lVar35);
          }
          lVar35 = 0;
          iVar18 = 0;
          iVar24 = 0;
          do {
            lVar20 = *(long *)(local_1c0 + lVar35 * 8);
            if (lVar27 < lVar20) {
              iVar18 = *(int *)(local_260 + lVar35 * 8);
              lVar27 = lVar20;
              iVar24 = *(int *)(local_1e0 + lVar35 * 8);
            }
            else if (lVar20 == lVar27) {
              lVar20 = *(long *)(local_1e0 + lVar35 * 8);
              if (lVar20 < iVar24) {
                iVar18 = *(int *)(local_260 + lVar35 * 8);
                iVar24 = (int)lVar20;
              }
              else if ((lVar20 == iVar24) && (*(long *)(local_260 + lVar35 * 8) < (long)iVar18)) {
                iVar18 = (int)*(long *)(local_260 + lVar35 * 8);
                iVar24 = (int)lVar20;
              }
            }
            lVar35 = lVar35 + 1;
          } while ((int)lVar35 != 4);
          auVar45 = vpcmpgtq_avx2(auVar47,local_280);
          auVar5._8_8_ = lStack_238;
          auVar5._0_8_ = local_240;
          auVar5._16_8_ = lStack_230;
          auVar5._24_8_ = lStack_228;
          auVar47 = vpcmpgtq_avx2(local_2c0,auVar5);
          auVar45 = vpor_avx2(auVar45,auVar47);
          if ((((auVar45 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               SUB321(auVar45 >> 0x7f,0) != '\0') || SUB321(auVar45 >> 0xbf,0) != '\0') ||
              auVar45[0x1f] < '\0') {
            *(byte *)&ppVar19->flag = (byte)ppVar19->flag | 0x40;
            lVar27 = 0;
            iVar24 = 0;
            iVar18 = 0;
          }
          ppVar19->score = (int)lVar27;
          ppVar19->end_query = iVar18;
          ppVar19->end_ref = iVar24;
          parasail_free(ptr_01);
          parasail_free(ptr_00);
          parasail_free(ptr);
          if (matrix->type == 0) {
            parasail_free(ptr_02);
            return ppVar19;
          }
          return ppVar19;
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vNegInf0;
    __m256i vOpen;
    __m256i vGap;
    __m256i vZero;
    __m256i vOne;
    __m256i vN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMaxH;
    __m256i vEndI;
    __m256i vEndJ;
    __m256i vILimit;
    __m256i vJLimit;
    __m256i vTDiag;
    __m256i vTIns;
    __m256i vTDel;
    __m256i vTZero;
    __m256i vTDiagE;
    __m256i vTInsE;
    __m256i vTDiagF;
    __m256i vTDelF;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }
        
    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vNegInf0 = _mm256_srli_si256_rpl(vNegInf, 8); /* shift in a 0 */
    vOpen = _mm256_set1_epi64x_rpl(open);
    vGap  = _mm256_set1_epi64x_rpl(gap);
    vZero = _mm256_set1_epi64x_rpl(0);
    vOne = _mm256_set1_epi64x_rpl(1);
    vN = _mm256_set1_epi64x_rpl(N);
    vNegOne = _mm256_set1_epi64x_rpl(-1);
    vI = _mm256_set_epi64x_rpl(0,1,2,3);
    vJreset = _mm256_set_epi64x_rpl(0,-1,-2,-3);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm256_set1_epi64x_rpl(s1Len);
    vJLimit = _mm256_set1_epi64x_rpl(s2Len);
    vTDiag = _mm256_set1_epi64x_rpl(PARASAIL_DIAG);
    vTIns = _mm256_set1_epi64x_rpl(PARASAIL_INS);
    vTDel = _mm256_set1_epi64x_rpl(PARASAIL_DEL);
    vTZero = _mm256_set1_epi64x_rpl(PARASAIL_ZERO);
    vTDiagE = _mm256_set1_epi64x_rpl(PARASAIL_DIAG_E);
    vTInsE = _mm256_set1_epi64x_rpl(PARASAIL_INS_E);
    vTDiagF = _mm256_set1_epi64x_rpl(PARASAIL_DIAG_F);
    vTDelF = _mm256_set1_epi64x_rpl(PARASAIL_DEL_F);

    /* initialize result */
    result = parasail_result_new_trace(s1Len, s2Len, 32, sizeof(int8_t));
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_TRACE
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;

    /* initialize heap variables */
    s2B= parasail_memalign_int64_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int64_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf0;
        __m256i vWH = vNegInf0;
        __m256i vE = vNegInf;
        __m256i vE_opn = vNegInf;
        __m256i vE_ext = vNegInf;
        __m256i vF = vNegInf;
        __m256i vF_opn = vNegInf;
        __m256i vF_ext = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        __m256i vIltLimit = _mm256_cmplt_epi64_rpl(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 8);
            vNH = _mm256_insert_epi64_rpl(vNH, H_pr[j], 3);
            vF = _mm256_srli_si256_rpl(vF, 8);
            vF = _mm256_insert_epi64_rpl(vF, F_pr[j], 3);
            vF_opn = _mm256_sub_epi64(vNH, vOpen);
            vF_ext = _mm256_sub_epi64(vF, vGap);
            vF = _mm256_max_epi64_rpl(vF_opn, vF_ext);
            vE_opn = _mm256_sub_epi64(vWH, vOpen);
            vE_ext = _mm256_sub_epi64(vE, vGap);
            vE = _mm256_max_epi64_rpl(vE_opn, vE_ext);
            vMat = _mm256_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm256_add_epi64(vNWH, vMat);
            vNWH = _mm256_max_epi64_rpl(vNWH, vZero);
            vWH = _mm256_max_epi64_rpl(vNWH, vE);
            vWH = _mm256_max_epi64_rpl(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi64(vJ,vNegOne);
                vWH = _mm256_andnot_si256(cond, vWH);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWH);
            }
            /* trace table */
            {
                __m256i cond_zero = _mm256_cmpeq_epi64(vWH, vZero);
                __m256i case1 = _mm256_cmpeq_epi64(vWH, vNWH);
                __m256i case2 = _mm256_cmpeq_epi64(vWH, vF);
                __m256i vT = _mm256_blendv_epi8(
                        _mm256_blendv_epi8(vTIns, vTDel, case2),
                        _mm256_blendv_epi8(vTDiag, vTZero, cond_zero),
                        case1);
                __m256i condE = _mm256_cmpgt_epi64(vE_opn, vE_ext);
                __m256i condF = _mm256_cmpgt_epi64(vF_opn, vF_ext);
                __m256i vET = _mm256_blendv_epi8(vTInsE, vTDiagE, condE);
                __m256i vFT = _mm256_blendv_epi8(vTDelF, vTDiagF, condF);
                vT = _mm256_or_si256(vT, vET);
                vT = _mm256_or_si256(vT, vFT);
                arr_store_si256(result->trace->trace_table, vT, i, s1Len, j, s2Len);
            }
            H_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vWH,0);
            F_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m256i cond_valid_J = _mm256_and_si256(
                        _mm256_cmpgt_epi64(vJ, vNegOne),
                        _mm256_cmplt_epi64_rpl(vJ, vJLimit));
                __m256i cond_valid_IJ = _mm256_and_si256(cond_valid_J, vIltLimit);
                __m256i cond_eq = _mm256_cmpeq_epi64(vWH, vMaxH);
                __m256i cond_max = _mm256_cmpgt_epi64(vWH, vMaxH);
                __m256i cond_all = _mm256_and_si256(cond_max, cond_valid_IJ);
                __m256i cond_Jlt = _mm256_cmplt_epi64_rpl(vJ, vEndJ);
                vMaxH = _mm256_blendv_epi8(vMaxH, vWH, cond_all);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm256_and_si256(cond_Jlt, cond_eq);
                cond_all = _mm256_and_si256(cond_all, cond_valid_IJ);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm256_add_epi64(vJ, vOne);
        }
        vI = _mm256_add_epi64(vI, vN);
    }

    /* alignment ending position */
    {
        int64_t *t = (int64_t*)&vMaxH;
        int64_t *i = (int64_t*)&vEndI;
        int64_t *j = (int64_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}